

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

Boxed_Number __thiscall chaiscript::Boxed_Number::get_as(Boxed_Number *this,Type_Info *inp_)

{
  Type_Info *pTVar1;
  bool bVar2;
  char cVar3;
  uchar uVar4;
  char16_t t;
  short t_00;
  unsigned_short t_01;
  wchar_t t_02;
  char32_t t_03;
  int iVar5;
  uint uVar6;
  longlong t_04;
  unsigned_long_long t_05;
  long lVar7;
  unsigned_long uVar8;
  bad_any_cast *this_00;
  Type_Info *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  Type_Info *ti;
  longdouble in_ST0;
  float t_06;
  double t_07;
  Boxed_Number BVar10;
  Type_Info local_230;
  Type_Info local_218;
  Type_Info local_200;
  Type_Info local_1e8;
  Type_Info local_1d0;
  Type_Info local_1b8;
  Type_Info local_1a0;
  Type_Info local_188;
  Type_Info local_170;
  Type_Info local_158;
  Type_Info local_140;
  Type_Info local_128;
  Type_Info local_110;
  Type_Info local_f8;
  Type_Info local_e0;
  Type_Info local_c8;
  Type_Info local_b0;
  Type_Info local_98;
  Type_Info local_80;
  Type_Info local_68;
  Type_Info local_50;
  Type_Info local_38;
  Type_Info *local_20;
  Type_Info *inp__local;
  Boxed_Number *this_local;
  
  local_20 = in_RDX;
  inp__local = inp_;
  this_local = this;
  user_type<int>();
  bVar2 = Type_Info::bare_equal(in_RDX,&local_38);
  pTVar1 = local_20;
  if (bVar2) {
    iVar5 = get_as<int>((Boxed_Number *)inp_);
    Boxed_Number<int>(this,iVar5);
    _Var9._M_pi = extraout_RDX;
  }
  else {
    user_type<double>();
    bVar2 = Type_Info::bare_equal(pTVar1,&local_50);
    pTVar1 = local_20;
    if (bVar2) {
      t_07 = get_as<double>((Boxed_Number *)inp_);
      Boxed_Number<double>(this,t_07);
      _Var9._M_pi = extraout_RDX_00;
    }
    else {
      user_type<float>();
      bVar2 = Type_Info::bare_equal(pTVar1,&local_68);
      pTVar1 = local_20;
      if (bVar2) {
        t_06 = get_as<float>((Boxed_Number *)inp_);
        Boxed_Number<float>(this,t_06);
        _Var9._M_pi = extraout_RDX_01;
      }
      else {
        user_type<long_double>();
        ti = &local_80;
        bVar2 = Type_Info::bare_equal(pTVar1,ti);
        pTVar1 = local_20;
        if (bVar2) {
          get_as<long_double>((longdouble *)inp_,(Boxed_Number *)ti);
          Boxed_Number<long_double>(this,in_ST0);
          _Var9._M_pi = extraout_RDX_02;
        }
        else {
          user_type<char>();
          bVar2 = Type_Info::bare_equal(pTVar1,&local_98);
          pTVar1 = local_20;
          if (bVar2) {
            cVar3 = get_as<char>((Boxed_Number *)inp_);
            Boxed_Number<char>(this,cVar3);
            _Var9._M_pi = extraout_RDX_03;
          }
          else {
            user_type<unsigned_char>();
            bVar2 = Type_Info::bare_equal(pTVar1,&local_b0);
            pTVar1 = local_20;
            if (bVar2) {
              uVar4 = get_as<unsigned_char>((Boxed_Number *)inp_);
              Boxed_Number<unsigned_char>(this,uVar4);
              _Var9._M_pi = extraout_RDX_04;
            }
            else {
              user_type<wchar_t>();
              bVar2 = Type_Info::bare_equal(pTVar1,&local_c8);
              pTVar1 = local_20;
              if (bVar2) {
                t_02 = get_as<wchar_t>((Boxed_Number *)inp_);
                Boxed_Number<wchar_t>(this,t_02);
                _Var9._M_pi = extraout_RDX_05;
              }
              else {
                user_type<char16_t>();
                bVar2 = Type_Info::bare_equal(pTVar1,&local_e0);
                pTVar1 = local_20;
                if (bVar2) {
                  t = get_as<char16_t>((Boxed_Number *)inp_);
                  Boxed_Number<char16_t>(this,t);
                  _Var9._M_pi = extraout_RDX_06;
                }
                else {
                  user_type<char32_t>();
                  bVar2 = Type_Info::bare_equal(pTVar1,&local_f8);
                  pTVar1 = local_20;
                  if (bVar2) {
                    t_03 = get_as<char32_t>((Boxed_Number *)inp_);
                    Boxed_Number<char32_t>(this,t_03);
                    _Var9._M_pi = extraout_RDX_07;
                  }
                  else {
                    user_type<unsigned_int>();
                    bVar2 = Type_Info::bare_equal(pTVar1,&local_110);
                    pTVar1 = local_20;
                    if (bVar2) {
                      uVar6 = get_as<unsigned_int>((Boxed_Number *)inp_);
                      Boxed_Number<unsigned_int>(this,uVar6);
                      _Var9._M_pi = extraout_RDX_08;
                    }
                    else {
                      user_type<long>();
                      bVar2 = Type_Info::bare_equal(pTVar1,&local_128);
                      pTVar1 = local_20;
                      if (bVar2) {
                        lVar7 = get_as<long>((Boxed_Number *)inp_);
                        Boxed_Number<long>(this,lVar7);
                        _Var9._M_pi = extraout_RDX_09;
                      }
                      else {
                        user_type<long_long>();
                        bVar2 = Type_Info::bare_equal(pTVar1,&local_140);
                        pTVar1 = local_20;
                        if (bVar2) {
                          t_04 = get_as<long_long>((Boxed_Number *)inp_);
                          Boxed_Number<long_long>(this,t_04);
                          _Var9._M_pi = extraout_RDX_10;
                        }
                        else {
                          user_type<unsigned_long>();
                          bVar2 = Type_Info::bare_equal(pTVar1,&local_158);
                          pTVar1 = local_20;
                          if (bVar2) {
                            uVar8 = get_as<unsigned_long>((Boxed_Number *)inp_);
                            Boxed_Number<unsigned_long>(this,uVar8);
                            _Var9._M_pi = extraout_RDX_11;
                          }
                          else {
                            user_type<unsigned_long_long>();
                            bVar2 = Type_Info::bare_equal(pTVar1,&local_170);
                            pTVar1 = local_20;
                            if (bVar2) {
                              t_05 = get_as<unsigned_long_long>((Boxed_Number *)inp_);
                              Boxed_Number<unsigned_long_long>(this,t_05);
                              _Var9._M_pi = extraout_RDX_12;
                            }
                            else {
                              user_type<signed_char>();
                              bVar2 = Type_Info::bare_equal(pTVar1,&local_188);
                              pTVar1 = local_20;
                              if (bVar2) {
                                cVar3 = get_as<signed_char>((Boxed_Number *)inp_);
                                Boxed_Number<signed_char>(this,cVar3);
                                _Var9._M_pi = extraout_RDX_13;
                              }
                              else {
                                user_type<short>();
                                bVar2 = Type_Info::bare_equal(pTVar1,&local_1a0);
                                pTVar1 = local_20;
                                if (bVar2) {
                                  t_00 = get_as<short>((Boxed_Number *)inp_);
                                  Boxed_Number<short>(this,t_00);
                                  _Var9._M_pi = extraout_RDX_14;
                                }
                                else {
                                  user_type<int>();
                                  bVar2 = Type_Info::bare_equal(pTVar1,&local_1b8);
                                  pTVar1 = local_20;
                                  if (bVar2) {
                                    iVar5 = get_as<int>((Boxed_Number *)inp_);
                                    Boxed_Number<int>(this,iVar5);
                                    _Var9._M_pi = extraout_RDX_15;
                                  }
                                  else {
                                    user_type<long>();
                                    bVar2 = Type_Info::bare_equal(pTVar1,&local_1d0);
                                    pTVar1 = local_20;
                                    if (bVar2) {
                                      lVar7 = get_as<long>((Boxed_Number *)inp_);
                                      Boxed_Number<long>(this,lVar7);
                                      _Var9._M_pi = extraout_RDX_16;
                                    }
                                    else {
                                      user_type<unsigned_char>();
                                      bVar2 = Type_Info::bare_equal(pTVar1,&local_1e8);
                                      pTVar1 = local_20;
                                      if (bVar2) {
                                        uVar4 = get_as<unsigned_char>((Boxed_Number *)inp_);
                                        Boxed_Number<unsigned_char>(this,uVar4);
                                        _Var9._M_pi = extraout_RDX_17;
                                      }
                                      else {
                                        user_type<unsigned_short>();
                                        bVar2 = Type_Info::bare_equal(pTVar1,&local_200);
                                        pTVar1 = local_20;
                                        if (bVar2) {
                                          t_01 = get_as<unsigned_short>((Boxed_Number *)inp_);
                                          Boxed_Number<unsigned_short>(this,t_01);
                                          _Var9._M_pi = extraout_RDX_18;
                                        }
                                        else {
                                          user_type<unsigned_int>();
                                          bVar2 = Type_Info::bare_equal(pTVar1,&local_218);
                                          if (bVar2) {
                                            uVar6 = get_as<unsigned_int>((Boxed_Number *)inp_);
                                            Boxed_Number<unsigned_int>(this,uVar6);
                                            _Var9._M_pi = extraout_RDX_19;
                                          }
                                          else {
                                            user_type<unsigned_long>();
                                            bVar2 = Type_Info::bare_equal(local_20,&local_230);
                                            if (!bVar2) {
                                              this_00 = (bad_any_cast *)__cxa_allocate_exception(8);
                                              memset(this_00,0,8);
                                              detail::exception::bad_any_cast::bad_any_cast(this_00)
                                              ;
                                              __cxa_throw(this_00,&detail::exception::bad_any_cast::
                                                                   typeinfo,
                                                          detail::exception::bad_any_cast::
                                                          ~bad_any_cast);
                                            }
                                            uVar8 = get_as<unsigned_long>((Boxed_Number *)inp_);
                                            Boxed_Number<unsigned_long>(this,uVar8);
                                            _Var9._M_pi = extraout_RDX_20;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  BVar10.bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var9._M_pi;
  BVar10.bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Boxed_Number)
         BVar10.bv.m_data.
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Number get_as(const Type_Info &inp_) const {
      if (inp_.bare_equal(user_type<int>())) {
        return Boxed_Number(get_as<int>());
      } else if (inp_.bare_equal(user_type<double>())) {
        return Boxed_Number(get_as<double>());
      } else if (inp_.bare_equal(user_type<float>())) {
        return Boxed_Number(get_as<float>());
      } else if (inp_.bare_equal(user_type<long double>())) {
        return Boxed_Number(get_as<long double>());
      } else if (inp_.bare_equal(user_type<char>())) {
        return Boxed_Number(get_as<char>());
      } else if (inp_.bare_equal(user_type<unsigned char>())) {
        return Boxed_Number(get_as<unsigned char>());
      } else if (inp_.bare_equal(user_type<wchar_t>())) {
        return Boxed_Number(get_as<wchar_t>());
      } else if (inp_.bare_equal(user_type<char16_t>())) {
        return Boxed_Number(get_as<char16_t>());
      } else if (inp_.bare_equal(user_type<char32_t>())) {
        return Boxed_Number(get_as<char32_t>());
      } else if (inp_.bare_equal(user_type<unsigned int>())) {
        return Boxed_Number(get_as<unsigned int>());
      } else if (inp_.bare_equal(user_type<long>())) {
        return Boxed_Number(get_as<long>());
      } else if (inp_.bare_equal(user_type<long long>())) {
        return Boxed_Number(get_as<long long>());
      } else if (inp_.bare_equal(user_type<unsigned long>())) {
        return Boxed_Number(get_as<unsigned long>());
      } else if (inp_.bare_equal(user_type<unsigned long long>())) {
        return Boxed_Number(get_as<unsigned long long>());
      } else if (inp_.bare_equal(user_type<int8_t>())) {
        return Boxed_Number(get_as<int8_t>());
      } else if (inp_.bare_equal(user_type<int16_t>())) {
        return Boxed_Number(get_as<int16_t>());
      } else if (inp_.bare_equal(user_type<int32_t>())) {
        return Boxed_Number(get_as<int32_t>());
      } else if (inp_.bare_equal(user_type<int64_t>())) {
        return Boxed_Number(get_as<int64_t>());
      } else if (inp_.bare_equal(user_type<uint8_t>())) {
        return Boxed_Number(get_as<uint8_t>());
      } else if (inp_.bare_equal(user_type<uint16_t>())) {
        return Boxed_Number(get_as<uint16_t>());
      } else if (inp_.bare_equal(user_type<uint32_t>())) {
        return Boxed_Number(get_as<uint32_t>());
      } else if (inp_.bare_equal(user_type<uint64_t>())) {
        return Boxed_Number(get_as<uint64_t>());
      } else {
        throw chaiscript::detail::exception::bad_any_cast();
      }
    }